

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O2

value * mjs::anon_unknown_33::get_property_names
                  (value *__return_storage_ptr__,gc_heap_ptr<mjs::global_object> *global,value *o,
                  bool check_enumerable)

{
  value *pvVar1;
  gc_heap_ptr_untyped *this;
  object *this_00;
  void *pvVar2;
  long *plVar3;
  uint32_t index;
  long lVar4;
  ulong uVar5;
  object_ptr a;
  vector<mjs::string,_std::allocator<mjs::string>_> n;
  gc_heap_ptr_untyped local_e0;
  gc_heap *local_d0;
  ulong local_c8;
  wstring_view local_c0;
  vector<mjs::string,_std::allocator<mjs::string>_> local_b0;
  wstring local_98;
  gc_heap_ptr_untyped local_78;
  undefined1 local_68 [56];
  
  pvVar1 = (value *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::validate_object((global_object *)local_68,pvVar1);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_68);
  this = &value::object_value(o)->super_gc_heap_ptr_untyped;
  this_00 = (object *)gc_heap_ptr_untyped::get(this);
  object::own_property_names(&local_b0,this_00,check_enumerable);
  uVar5 = (long)local_b0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_b0.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                super__Vector_impl_data._M_start;
  make_array((gc_heap_ptr<mjs::global_object> *)&local_e0,(uint32_t)global);
  pvVar2 = gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  local_d0 = *(gc_heap **)((long)pvVar2 + 8);
  local_c8 = uVar5 >> 4 & 0xffffffff;
  lVar4 = 0;
  pvVar1 = (value *)(local_68 + 0x10);
  for (uVar5 = 0; local_c8 != uVar5; uVar5 = uVar5 + 1) {
    plVar3 = (long *)gc_heap_ptr_untyped::get(&local_e0);
    index_string_abi_cxx11_(&local_98,(mjs *)(uVar5 & 0xffffffff),index);
    local_c0._M_len = local_98._M_string_length;
    local_c0._M_str = local_98._M_dataplus._M_p;
    string::string((string *)&local_78,local_d0,&local_c0);
    value::value(pvVar1,(string *)
                        ((long)&((local_b0.
                                  super__Vector_base<mjs::string,_std::allocator<mjs::string>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->
                                super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.heap_ +
                        lVar4));
    (**(code **)(*plVar3 + 8))(plVar3,&local_78,pvVar1,0);
    value::~value(pvVar1);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_78);
    std::__cxx11::wstring::~wstring((wstring *)&local_98);
    lVar4 = lVar4 + 0x10;
  }
  value::value(__return_storage_ptr__,(object_ptr *)&local_e0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_e0);
  std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector(&local_b0);
  return __return_storage_ptr__;
}

Assistant:

value get_property_names(const gc_heap_ptr<global_object>& global, const value& o, bool check_enumerable) {
    global->validate_object(o);
    const auto n = o.object_value()->own_property_names(check_enumerable);
    const auto ns = static_cast<uint32_t>(n.size());
    auto a = make_array(global, ns);
    auto& h = global->heap();
    for (uint32_t i = 0; i < ns; ++i) {
        a->put(string{h,index_string(i)}, value{n[i]});
    }
    return value{a};
}